

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

BalanceInfo si9ma::BinaryTree::is_balance_tree(TreeNode *head)

{
  BalanceInfo BVar1;
  int *piVar2;
  bool local_29;
  BalanceInfo local_28;
  BalanceInfo right_info;
  BalanceInfo left_info;
  TreeNode *head_local;
  BalanceInfo res;
  
  if (head == (TreeNode *)0x0) {
    BalanceInfo::BalanceInfo((BalanceInfo *)&head_local,true,0);
  }
  else {
    right_info = is_balance_tree(head->left);
    local_28 = is_balance_tree(head->right);
    piVar2 = std::max<int>(&right_info.height,&local_28.height);
    head_local._4_4_ = *piVar2 + 1;
    local_29 = false;
    if ((((ulong)right_info & 1) != 0) && (local_29 = false, ((ulong)local_28 & 1) != 0)) {
      local_28.height = right_info.height - local_28.height;
      if (local_28.height < 1) {
        local_28.height = -local_28.height;
      }
      local_29 = local_28.height < 2;
    }
    head_local._0_4_ = CONCAT31(head_local._1_3_,local_29);
  }
  BVar1.height = head_local._4_4_;
  BVar1._0_4_ = head_local._0_4_;
  return BVar1;
}

Assistant:

BalanceInfo BinaryTree::is_balance_tree(const TreeNode *head) {
        if (head == nullptr)
            return BalanceInfo{true,0};

        BalanceInfo res;
        auto left_info = is_balance_tree(head->left);
        auto right_info = is_balance_tree(head->right);

        res.height = max(left_info.height,right_info.height) + 1;
        res.is_balance = left_info.is_balance && right_info.is_balance && (abs(left_info.height - right_info.height) < 2);

        return res;
    }